

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O1

void bfgs_rec(double *H,int N,int iter,int m,double *jac,double *sk,double *yk,double *r)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double *B;
  double *C;
  double *A;
  double *B_00;
  void *__s;
  void *__s_00;
  void *__s_01;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  long local_68;
  ulong local_40;
  
  lVar10 = (long)N;
  sVar8 = lVar10 * 8;
  B = (double *)malloc(sVar8);
  C = (double *)malloc(8);
  A = (double *)malloc(sVar8);
  B_00 = (double *)malloc(sVar8);
  sVar8 = (long)m << 3;
  __s = malloc(sVar8);
  __s_00 = malloc(sVar8);
  __s_01 = malloc(sVar8);
  uVar9 = (ulong)(uint)N;
  if (0 < N) {
    sVar8 = uVar9 * 8;
    memset(A,0,sVar8);
    memset(B_00,0,sVar8);
    memcpy(B,jac,sVar8);
  }
  uVar2 = m;
  if (iter < m) {
    uVar2 = iter;
  }
  if (0 < m) {
    sVar8 = (ulong)(uint)m * 8;
    memset(__s_00,0,sVar8);
    memset(__s,0,sVar8);
    memset(__s_01,0,(ulong)(uint)m << 3);
  }
  if (0 < (int)uVar2) {
    if (m < iter) {
      iter = m;
    }
    local_68 = (long)iter;
    pdVar6 = yk + (local_68 + -1) * lVar10;
    local_40 = 0;
    do {
      if (0 < N) {
        iVar3 = ((uVar2 - 1) - (int)local_40) * N;
        memcpy(A,yk + iVar3,uVar9 * 8);
        memcpy(B_00,sk + iVar3,uVar9 * 8);
      }
      local_68 = local_68 + -1;
      mmult(A,B_00,C,1,N,1);
      dVar11 = *C;
      *(double *)((long)__s_01 + local_68 * 8) = 1.0 / dVar11;
      mmult(B_00,B,(double *)((long)__s + local_68 * 8),1,N,1);
      dVar11 = (1.0 / dVar11) * *(double *)((long)__s + local_68 * 8);
      *(double *)((long)__s + local_68 * 8) = dVar11;
      if (0 < N) {
        uVar4 = 0;
        do {
          B[uVar4] = pdVar6[uVar4] * -dVar11 + B[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar9 != uVar4);
      }
      local_40 = local_40 + 1;
      pdVar6 = pdVar6 + -lVar10;
    } while (local_40 != uVar2);
  }
  mmult(H,B,r,N,N,1);
  if (0 < (int)uVar2) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      if (0 < N) {
        memcpy(A,yk + (uint)((int)uVar7 * N),uVar9 * 8);
      }
      mmult(A,r,(double *)((long)__s_00 + uVar7 * 8),1,N,1);
      dVar11 = *(double *)((long)__s_01 + uVar7 * 8) * *(double *)((long)__s_00 + uVar7 * 8);
      *(double *)((long)__s_00 + uVar7 * 8) = dVar11;
      if (0 < N) {
        dVar1 = *(double *)((long)__s + uVar7 * 8);
        uVar5 = 0;
        do {
          r[uVar5] = sk[uVar4 + uVar5] * (dVar1 - dVar11) + r[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar9 != uVar5);
      }
      uVar7 = uVar7 + 1;
      uVar4 = (ulong)(uint)((int)uVar4 + N);
    } while (uVar7 != uVar2);
  }
  free(B);
  free(C);
  free(__s_01);
  free(__s);
  free(A);
  free(B_00);
  free(__s_00);
  return;
}

Assistant:

void bfgs_rec(double *H,int N,int iter,int m,double *jac,double *sk,double *yk,double *r) {
	int i,ptr,k,bound;
	double *q,*temp,*rho,*alpha,*temp1,*temp2,*qs,*beta;


	q = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *N);
	temp2 = (double*) malloc(sizeof(double) *N);
	alpha = (double*) malloc(sizeof(double) * m);
	beta = (double*) malloc(sizeof(double) * m);
	rho = (double*) malloc(sizeof(double) * m);
	qs = (double*) malloc(sizeof(double) * m);

	k = 0; ptr = 0; i = 0; bound = 0;
	
	for(i = 0;i < N;++i) {
		q[i] = jac[i];
		temp1[i] = 0.0;
		temp2[i] = 0.0;
	}

	if (iter <= m) {
		bound = iter;
	} else {
		bound = m;
	}

	for (i = 0; i < m;++i) {
		alpha[i] = beta[i] = 0.0;
	}

	for (i = 0; i < m;++i) {
		rho[i] = qs[i] = 0.0;
	}

	//mmult(yk,sk,temp,1,N,1);

	for (i = bound - 1; i >= 0; --i) {
		ptr = i * N;
		for(k = 0; k < N;++k) {
			temp1[k] = yk[ptr+k];
			temp2[k] = sk[ptr+k];
		}
		mmult(temp1,temp2,temp,1,N,1);
		rho[i] = 1.0/temp[0];
		mmult(temp2,q,alpha+i,1,N,1);
		alpha[i] *= rho[i];
		for(k = 0; k < N; ++k) {
			q[k] = q[k] - alpha[i] * yk[ptr + k];
		}
	}
	mmult(H,q,r,N,N,1);
	for (i = 0; i < bound;++i) {
		ptr = i * N;
		for(k = 0; k < N;++k) {
			temp1[k] = yk[ptr+k];
			//temp2[k] = r[ptr+k];
		}
		mmult(temp1,r,beta+i,1,N,1);
		beta[i] *= rho[i];
		for (k = 0; k < N;++k) {
			r[k] += sk[ptr+k] * (alpha[i] - beta[i]);
		}
	}

	

	free(q);
	free(temp);
	free(rho);
	free(alpha);
	free(temp1);
	free(temp2);
	free(qs);
	free(beta);
}